

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetArrayRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *values,SizeType count,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Ch **ppCVar1;
  void *__dest;
  
  (this->data_).f.flags = 4;
  if (count == 0) {
    ppCVar1 = &(this->data_).s.str;
    *ppCVar1 = (Ch *)((ulong)*ppCVar1 & 0xffff000000000000);
  }
  else {
    __dest = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,(ulong)count << 4);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).s.str & 0xffff000000000000 | (ulong)__dest);
    memcpy(__dest,values,(ulong)count << 4);
  }
  (this->data_).s.hashcode = count;
  (this->data_).s.length = count;
  return;
}

Assistant:

void SetArrayRaw(GenericValue* values, SizeType count, Allocator& allocator) {
        data_.f.flags = kArrayFlag;
        if (count) {
            GenericValue* e = static_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
            SetElementsPointer(e);
            std::memcpy(static_cast<void*>(e), values, count * sizeof(GenericValue));
        }
        else
            SetElementsPointer(0);
        data_.a.size = data_.a.capacity = count;
    }